

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

void Gia_ManCreateRefs(Gia_Man_t *p)

{
  int iVar1;
  int *piVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  long lVar5;
  
  if (p->pRefs != (int *)0x0) {
    __assert_fail("p->pRefs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                  ,0x2d0,"void Gia_ManCreateRefs(Gia_Man_t *)");
  }
  iVar1 = p->nObjs;
  piVar2 = (int *)calloc((long)iVar1,4);
  p->pRefs = piVar2;
  lVar5 = 0;
  while( true ) {
    if (iVar1 <= lVar5) {
      return;
    }
    pGVar3 = Gia_ManObj(p,(int)lVar5);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    iVar1 = (int)*(ulong *)pGVar3;
    uVar4 = *(ulong *)pGVar3 & 0x1fffffff;
    if (uVar4 == 0x1fffffff || iVar1 < 0) {
      if (iVar1 < 0 && (int)uVar4 != 0x1fffffff) {
        Gia_ObjRefFanin0Inc(p,pGVar3);
      }
    }
    else {
      Gia_ObjRefFanin0Inc(p,pGVar3);
      iVar1 = Gia_ObjIsBuf(pGVar3);
      if (iVar1 == 0) {
        Gia_ObjRefInc(p,pGVar3 + -(ulong)(*(uint *)&pGVar3->field_0x4 & 0x1fffffff));
      }
      if ((p->pMuxes != (uint *)0x0) && (p->pMuxes[lVar5] != 0)) {
        pGVar3 = Gia_ObjFanin2(p,pGVar3);
        Gia_ObjRefInc(p,pGVar3);
      }
    }
    lVar5 = lVar5 + 1;
    iVar1 = p->nObjs;
  }
  return;
}

Assistant:

void Gia_ManCreateRefs( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int i;
    assert( p->pRefs == NULL );
    p->pRefs = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
        {
            Gia_ObjRefFanin0Inc( p, pObj );
            if ( !Gia_ObjIsBuf(pObj) )
                Gia_ObjRefFanin1Inc( p, pObj );
            if ( Gia_ObjIsMuxId(p, i) )
                Gia_ObjRefFanin2Inc( p, pObj );
        }
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ObjRefFanin0Inc( p, pObj );
    }
}